

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DisposeAllPolyPts(Clipper *this)

{
  size_type sVar1;
  ulong local_18;
  size_type i;
  Clipper *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                      (&this->m_PolyOuts);
    if (sVar1 <= local_18) break;
    DisposeOutRec(this,local_18);
    local_18 = local_18 + 1;
  }
  std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::clear(&this->m_PolyOuts)
  ;
  return;
}

Assistant:

void Clipper::DisposeAllPolyPts(){
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    DisposeOutRec(i);
  m_PolyOuts.clear();
}